

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O0

Value * __thiscall
soul::CompileTimeIntrinsicEvaluation::perform
          (Value *__return_storage_ptr__,CompileTimeIntrinsicEvaluation *this,IntrinsicType i,
          ArrayView<soul::Value> args,bool isFloat)

{
  Value *pVVar1;
  undefined4 in_register_00000014;
  CompileTimeIntrinsicEvaluation *this_00;
  ArrayView<soul::Value> args_00;
  ArrayView<soul::Value> args_01;
  ArrayView<soul::Value> args_02;
  ArrayView<soul::Value> args_03;
  ArrayView<soul::Value> args_04;
  ArrayView<soul::Value> args_05;
  ArrayView<soul::Value> args_06;
  ArrayView<soul::Value> args_07;
  ArrayView<soul::Value> args_08;
  ArrayView<soul::Value> args_09;
  ArrayView<soul::Value> args_10;
  ArrayView<soul::Value> args_11;
  ArrayView<soul::Value> args_12;
  ArrayView<soul::Value> args_13;
  ArrayView<soul::Value> args_14;
  ArrayView<soul::Value> args_15;
  ArrayView<soul::Value> args_16;
  ArrayView<soul::Value> args_17;
  ArrayView<soul::Value> args_18;
  ArrayView<soul::Value> args_19;
  ArrayView<soul::Value> args_20;
  ArrayView<soul::Value> args_21;
  ArrayView<soul::Value> args_22;
  ArrayView<soul::Value> args_23;
  ArrayView<soul::Value> args_24;
  ArrayView<soul::Value> args_25;
  ArrayView<soul::Value> args_26;
  ArrayView<soul::Value> args_27;
  ArrayView<soul::Value> args_28;
  ArrayView<soul::Value> args_29;
  ArrayView<soul::Value> args_30;
  ArrayView<soul::Value> args_31;
  ArrayView<soul::Value> args_32;
  ArrayView<soul::Value> args_33;
  ArrayView<soul::Value> args_34;
  bool isFloat_local;
  IntrinsicType i_local;
  ArrayView<soul::Value> args_local;
  
  this_00 = (CompileTimeIntrinsicEvaluation *)CONCAT44(in_register_00000014,i);
  pVVar1 = args.s;
  switch((ulong)this & 0xffffffff) {
  case 0:
    throwInternalCompilerError("perform",0x59);
  case 1:
    if (((undefined1  [16])args & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      args_01.e = (Value *)abs_i;
      args_01.s = pVVar1;
      perform<long,long>(__return_storage_ptr__,this_00,args_01,
                         (_func_long_long *)__return_storage_ptr__);
    }
    else {
      args_00.e = (Value *)abs_d;
      args_00.s = pVVar1;
      perform<double,double>
                (__return_storage_ptr__,this_00,args_00,
                 (_func_double_double *)__return_storage_ptr__);
    }
    break;
  case 2:
    if (((undefined1  [16])args & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      args_03.e = (Value *)min_i;
      args_03.s = pVVar1;
      perform<long,long>(__return_storage_ptr__,this_00,args_03,
                         (_func_long_long_long *)__return_storage_ptr__);
    }
    else {
      args_02.e = (Value *)min_d;
      args_02.s = pVVar1;
      perform<double,double>
                (__return_storage_ptr__,this_00,args_02,
                 (_func_double_double_double *)__return_storage_ptr__);
    }
    break;
  case 3:
    if (((undefined1  [16])args & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      args_05.e = (Value *)max_i;
      args_05.s = pVVar1;
      perform<long,long>(__return_storage_ptr__,this_00,args_05,
                         (_func_long_long_long *)__return_storage_ptr__);
    }
    else {
      args_04.e = (Value *)max_d;
      args_04.s = pVVar1;
      perform<double,double>
                (__return_storage_ptr__,this_00,args_04,
                 (_func_double_double_double *)__return_storage_ptr__);
    }
    break;
  case 4:
    if (((undefined1  [16])args & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      args_07.e = (Value *)clamp_i;
      args_07.s = pVVar1;
      perform<long,long>(__return_storage_ptr__,this_00,args_07,
                         (_func_long_long_long_long *)__return_storage_ptr__);
    }
    else {
      args_06.e = (Value *)clamp_d;
      args_06.s = pVVar1;
      perform<double,double>
                (__return_storage_ptr__,this_00,args_06,
                 (_func_double_double_double_double *)__return_storage_ptr__);
    }
    break;
  case 5:
    if (((undefined1  [16])args & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      args_09.e = (Value *)wrap_i;
      args_09.s = pVVar1;
      perform<long,long>(__return_storage_ptr__,this_00,args_09,
                         (_func_long_long_long *)__return_storage_ptr__);
    }
    else {
      args_08.e = (Value *)wrap_d;
      args_08.s = pVVar1;
      perform<double,double>
                (__return_storage_ptr__,this_00,args_08,
                 (_func_double_double_double *)__return_storage_ptr__);
    }
    break;
  case 6:
    args_10.e = (Value *)fmod_d;
    args_10.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_10,
               (_func_double_double_double *)__return_storage_ptr__);
    break;
  case 7:
    args_11.e = (Value *)remainder_d;
    args_11.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_11,
               (_func_double_double_double *)__return_storage_ptr__);
    break;
  case 8:
    args_12.e = (Value *)floor_d;
    args_12.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_12,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 9:
    args_13.e = (Value *)ceil_d;
    args_13.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_13,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 10:
    args_14.e = (Value *)addModulo2Pi_d;
    args_14.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_14,
               (_func_double_double_double *)__return_storage_ptr__);
    break;
  case 0xb:
    args_15.e = (Value *)sqrt_d;
    args_15.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_15,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0xc:
    args_16.e = (Value *)pow_d;
    args_16.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_16,
               (_func_double_double_double *)__return_storage_ptr__);
    break;
  case 0xd:
    args_17.e = (Value *)exp_d;
    args_17.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_17,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0xe:
    args_18.e = (Value *)log_d;
    args_18.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_18,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0xf:
    args_19.e = (Value *)log10_d;
    args_19.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_19,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x10:
    args_20.e = (Value *)sin_d;
    args_20.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_20,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x11:
    args_21.e = (Value *)cos_d;
    args_21.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_21,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x12:
    args_22.e = (Value *)tan_d;
    args_22.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_22,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x13:
    args_23.e = (Value *)sinh_d;
    args_23.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_23,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x14:
    args_24.e = (Value *)cosh_d;
    args_24.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_24,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x15:
    args_25.e = (Value *)tanh_d;
    args_25.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_25,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x16:
    args_26.e = (Value *)asinh_d;
    args_26.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_26,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x17:
    args_27.e = (Value *)acosh_d;
    args_27.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_27,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x18:
    args_28.e = (Value *)atanh_d;
    args_28.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_28,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x19:
    args_29.e = (Value *)asin_d;
    args_29.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_29,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x1a:
    args_30.e = (Value *)acos_d;
    args_30.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_30,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x1b:
    args_31.e = (Value *)atan_d;
    args_31.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_31,(_func_double_double *)__return_storage_ptr__)
    ;
    break;
  case 0x1c:
    args_32.e = (Value *)atan2_d;
    args_32.s = pVVar1;
    perform<double,double>
              (__return_storage_ptr__,this_00,args_32,
               (_func_double_double_double *)__return_storage_ptr__);
    break;
  case 0x1d:
    args_33.e = (Value *)isnan_d;
    args_33.s = pVVar1;
    perform<bool,double>
              (__return_storage_ptr__,this_00,args_33,(_func_bool_double *)__return_storage_ptr__);
    break;
  case 0x1e:
    args_34.e = (Value *)isinf_d;
    args_34.s = pVVar1;
    perform<bool,double>
              (__return_storage_ptr__,this_00,args_34,(_func_bool_double *)__return_storage_ptr__);
    break;
  case 0x1f:
    soul::Value::Value(__return_storage_ptr__);
    break;
  case 0x20:
    soul::Value::Value(__return_storage_ptr__);
    break;
  case 0x21:
    soul::Value::Value(__return_storage_ptr__);
    break;
  case 0x22:
    soul::Value::Value(__return_storage_ptr__);
    break;
  case 0x23:
    soul::Value::Value(__return_storage_ptr__);
    break;
  case 0x24:
    soul::Value::Value(__return_storage_ptr__);
    break;
  default:
    soul::Value::Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Value perform (IntrinsicType i, ArrayView<Value> args, bool isFloat)
    {
        switch (i)
        {
            case IntrinsicType::none:                    SOUL_ASSERT_FALSE; break;
            case IntrinsicType::abs:                     return isFloat ? perform (args, abs_d)   : perform (args, abs_i);
            case IntrinsicType::min:                     return isFloat ? perform (args, min_d)   : perform (args, min_i);
            case IntrinsicType::max:                     return isFloat ? perform (args, max_d)   : perform (args, max_i);
            case IntrinsicType::clamp:                   return isFloat ? perform (args, clamp_d) : perform (args, clamp_i);
            case IntrinsicType::wrap:                    return isFloat ? perform (args, wrap_d)  : perform (args, wrap_i);
            case IntrinsicType::fmod:                    return perform (args, fmod_d);
            case IntrinsicType::remainder:               return perform (args, remainder_d);
            case IntrinsicType::floor:                   return perform (args, floor_d);
            case IntrinsicType::ceil:                    return perform (args, ceil_d);
            case IntrinsicType::addModulo2Pi:            return perform (args, addModulo2Pi_d);
            case IntrinsicType::sqrt:                    return perform (args, sqrt_d);
            case IntrinsicType::pow:                     return perform (args, pow_d);
            case IntrinsicType::exp:                     return perform (args, exp_d);
            case IntrinsicType::log:                     return perform (args, log_d);
            case IntrinsicType::log10:                   return perform (args, log10_d);
            case IntrinsicType::sin:                     return perform (args, sin_d);
            case IntrinsicType::cos:                     return perform (args, cos_d);
            case IntrinsicType::tan:                     return perform (args, tan_d);
            case IntrinsicType::sinh:                    return perform (args, sinh_d);
            case IntrinsicType::cosh:                    return perform (args, cosh_d);
            case IntrinsicType::tanh:                    return perform (args, tanh_d);
            case IntrinsicType::asinh:                   return perform (args, asinh_d);
            case IntrinsicType::acosh:                   return perform (args, acosh_d);
            case IntrinsicType::atanh:                   return perform (args, atanh_d);
            case IntrinsicType::asin:                    return perform (args, asin_d);
            case IntrinsicType::acos:                    return perform (args, acos_d);
            case IntrinsicType::atan:                    return perform (args, atan_d);
            case IntrinsicType::atan2:                   return perform (args, atan2_d);
            case IntrinsicType::isnan:                   return perform (args, isnan_d);
            case IntrinsicType::isinf:                   return perform (args, isinf_d);
            case IntrinsicType::roundToInt:              return {};
            case IntrinsicType::sum:                     return {};
            case IntrinsicType::product:                 return {};
            case IntrinsicType::get_array_size:          return {};
            case IntrinsicType::read:                    return {};
            case IntrinsicType::readLinearInterpolated:  return {};
        }

        return {};
    }